

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createVectorInsertDynamic
          (Builder *this,Id vector,Id typeId,Id component,Id componentIndex)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *insert;
  Id componentIndex_local;
  Id component_local;
  Id typeId_local;
  Id vector_local;
  Builder *this_local;
  
  insert._0_4_ = componentIndex;
  insert._4_4_ = component;
  componentIndex_local = typeId;
  component_local = vector;
  _typeId_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,componentIndex_local,OpVectorInsertDynamic);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,3);
  spv::Instruction::addIdOperand(local_28,component_local);
  spv::Instruction::addIdOperand(local_28,insert._4_4_);
  spv::Instruction::addIdOperand(local_28,(Id)insert);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  addInstruction(this,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  IVar1 = spv::Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createVectorInsertDynamic(Id vector, Id typeId, Id component, Id componentIndex)
{
    Instruction* insert = new Instruction(getUniqueId(), typeId, OpVectorInsertDynamic);
    insert->reserveOperands(3);
    insert->addIdOperand(vector);
    insert->addIdOperand(component);
    insert->addIdOperand(componentIndex);
    addInstruction(std::unique_ptr<Instruction>(insert));

    return insert->getResultId();
}